

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O2

EdgeBool * __thiscall
indigox::utils::Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>::
GetEdge(EdgeBool *__return_storage_ptr__,
       Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph> *this,
       VertType u,VertType v)

{
  adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::MolVertProp,_indigox::MolEdgeProp,_boost::no_property,_boost::listS>,_boost::listS,_boost::setS,_boost::undirectedS,_indigox::MolVertProp,_indigox::MolEdgeProp,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::MolVertProp,_indigox::MolEdgeProp,_boost::no_property,_boost::listS>,_boost::listS,_boost::setS,_boost::undirectedS,_indigox::MolVertProp,_indigox::MolEdgeProp,_boost::no_property,_boost::listS>::config>_>
  *in_R8;
  
  boost::
  edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,boost::listS,boost::undirectedS,indigox::MolVertProp,indigox::MolEdgeProp,boost::no_property,boost::listS>,boost::listS,boost::setS,boost::undirectedS,indigox::MolVertProp,indigox::MolEdgeProp,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,boost::listS,boost::undirectedS,indigox::MolVertProp,indigox::MolEdgeProp,boost::no_property,boost::listS>,boost::listS,boost::setS,boost::undirectedS,indigox::MolVertProp,indigox::MolEdgeProp,boost::no_property,boost::listS>::config>>
            (__return_storage_ptr__,(boost *)u,v,
             (this->graph_).
             super___shared_ptr<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::MolVertProp,_indigox::MolEdgeProp,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,in_R8);
  return __return_storage_ptr__;
}

Assistant:

EdgeBool GetEdge(VertType u, VertType v) const
      {
        return boost::edge(u, v, *graph_);
      }